

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::BinaryExpressionSyntax::isKind(SyntaxKind kind)

{
  uint uVar1;
  
  if ((int)kind < 0xfa) {
    if ((kind < CasePropertyExpr) && ((0x2801c201007810c0U >> ((ulong)kind & 0x3f) & 1) != 0)) {
      return true;
    }
    if ((kind - EqualityExpression < 0x28) &&
       ((0xc000000001U >> ((ulong)(kind - EqualityExpression) & 0x3f) & 1) != 0)) {
      return true;
    }
    uVar1 = kind - DivideAssignmentExpression;
  }
  else {
    if ((int)kind < 0x14b) {
      if (0x3e < kind - InequalityExpression) {
        return false;
      }
      if ((0x60030007f8030001U >> ((ulong)(kind - InequalityExpression) & 0x3f) & 1) == 0) {
        return false;
      }
      return true;
    }
    if ((kind - NonblockingAssignmentExpression < 0x29) &&
       ((0x10000000021U >> ((ulong)(kind - NonblockingAssignmentExpression) & 0x3f) & 1) != 0)) {
      return true;
    }
    if ((kind - WildcardEqualityExpression < 0xc) &&
       ((0x803U >> (kind - WildcardEqualityExpression & 0x1f) & 1) != 0)) {
      return true;
    }
    uVar1 = kind - SubtractAssignmentExpression;
  }
  if (1 < uVar1) {
    return false;
  }
  return true;
}

Assistant:

bool BinaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::AddExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::PowerExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::XorAssignmentExpression:
            return true;
        default:
            return false;
    }
}